

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O3

void __thiscall LLVMBC::StreamState::append(StreamState *this,MDOperand *md)

{
  MetadataKind MVar1;
  String *ts;
  Constant *value;
  LoggingCallback p_Var2;
  void *pvVar3;
  char buffer [4096];
  unsigned_long local_1018;
  undefined5 uStack_1010;
  undefined3 uStack_100b;
  undefined5 uStack_1008;
  char acStack_1003 [4083];
  
  if (md != (MDOperand *)0x0) {
    MVar1 = MDOperand::get_metadata_kind(md);
    switch(MVar1) {
    case NamedNode:
      MVar1 = MDOperand::get_metadata_kind(md);
      if (MVar1 == NamedNode) {
        append(this,(NamedMDNode *)md);
        return;
      }
      p_Var2 = ::dxil_spv::get_thread_log_callback();
      if (p_Var2 == (LoggingCallback)0x0) {
        append();
        std::terminate();
      }
      break;
    case Node:
      MVar1 = MDOperand::get_metadata_kind(md);
      if (MVar1 == Node) {
        local_1018 = MDNode::get_tween_id((MDNode *)md);
        append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x1c4969,&local_1018);
        return;
      }
      p_Var2 = ::dxil_spv::get_thread_log_callback();
      if (p_Var2 == (LoggingCallback)0x0) {
        append();
        std::terminate();
      }
      break;
    case Constant:
      MVar1 = MDOperand::get_metadata_kind(md);
      if (MVar1 == Constant) {
        value = ConstantAsMetadata::getValue((ConstantAsMetadata *)md);
        append(this,&value->super_Value,false);
        return;
      }
      p_Var2 = ::dxil_spv::get_thread_log_callback();
      if (p_Var2 == (LoggingCallback)0x0) {
        append();
        std::terminate();
      }
      break;
    case String:
      MVar1 = MDOperand::get_metadata_kind(md);
      if (MVar1 == String) {
        ts = MDString::getString_abi_cxx11_((MDString *)md);
        append<char_const(&)[2],std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&,char_const(&)[2]>
                  (this,(char (*) [2])0x1bef14,ts,(char (*) [2])0x1bef14);
        return;
      }
      p_Var2 = ::dxil_spv::get_thread_log_callback();
      if (p_Var2 == (LoggingCallback)0x0) {
        append();
        std::terminate();
      }
      break;
    case None:
      goto switchD_0018d67e_caseD_4;
    default:
      p_Var2 = ::dxil_spv::get_thread_log_callback();
      if (p_Var2 == (LoggingCallback)0x0) {
        append((StreamState *)md);
      }
      else {
        MVar1 = MDOperand::get_metadata_kind(md);
        snprintf((char *)&local_1018,0x1000,"Unknown MetadataKind %u.\n",(ulong)MVar1);
        pvVar3 = ::dxil_spv::get_thread_log_callback_userdata();
        (*p_Var2)(pvVar3,Error,(char *)&local_1018);
      }
      return;
    }
    uStack_1008 = 0x6163206e69;
    builtin_strncpy(acStack_1003,"st<T>.\n",8);
    local_1018._0_1_ = 'I';
    local_1018._1_1_ = 'n';
    local_1018._2_1_ = 'v';
    local_1018._3_1_ = 'a';
    local_1018._4_1_ = 'l';
    local_1018._5_1_ = 'i';
    local_1018._6_1_ = 'd';
    local_1018._7_1_ = ' ';
    uStack_1010 = 0x2065707974;
    uStack_100b = 0x204449;
    pvVar3 = ::dxil_spv::get_thread_log_callback_userdata();
    (*p_Var2)(pvVar3,Error,(char *)&local_1018);
    std::terminate();
  }
switchD_0018d67e_caseD_4:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"null",4);
  return;
}

Assistant:

void StreamState::append(MDOperand *md)
{
	if (md)
	{
		switch (md->get_metadata_kind())
		{
		case MetadataKind::NamedNode:
			return append(cast<NamedMDNode>(md));
		case MetadataKind::Node:
			return append(cast<MDNode>(md), false);
		case MetadataKind::Constant:
			return append(cast<ConstantAsMetadata>(md)->getValue());
		case MetadataKind::String:
			return append("\"", cast<MDString>(md)->getString(), "\"");
		case MetadataKind::None:
			return append("null");
		default:
			LOGE("Unknown MetadataKind %u.\n", unsigned(md->get_metadata_kind()));
			break;
		}
	}
	else
		append("null");
}